

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

SummaryColumn * __thiscall
Catch::SummaryColumn::addRow(SummaryColumn *__return_storage_ptr__,SummaryColumn *this,size_t count)

{
  pointer pbVar1;
  pointer pcVar2;
  SummaryColumn *pSVar3;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar4;
  size_t sVar5;
  pointer __rhs;
  string row;
  ReusableStringStream rss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  SummaryColumn *local_70;
  ReusableStringStream local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_68.super_NonCopyable._vptr_NonCopyable = (_func_int **)&PTR__ReusableStringStream_00225f68;
  pSVar4 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  sVar5 = StringStreams::add(&pSVar4->super_StringStreams);
  local_68.m_index = sVar5;
  pSVar4 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  local_68.m_oss =
       *(ostream **)
        &(pSVar4->super_StringStreams).m_streams.
         super__Vector_base<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[sVar5]._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  std::ostream::_M_insert<unsigned_long>((ulong)local_68.m_oss);
  local_70 = __return_storage_ptr__;
  std::__cxx11::stringbuf::str();
  __rhs = (this->rows).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->rows).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__rhs != pbVar1) {
    do {
      while (__rhs->_M_string_length < local_90._M_string_length) {
        std::operator+(&local_50,' ',__rhs);
        std::__cxx11::string::operator=((string *)__rhs,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      while (local_90._M_string_length < __rhs->_M_string_length) {
        std::operator+(&local_50,' ',&local_90);
        std::__cxx11::string::operator=((string *)&local_90,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      __rhs = __rhs + 1;
    } while (__rhs != pbVar1);
  }
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->rows,&local_90);
  pSVar3 = local_70;
  (local_70->label)._M_dataplus._M_p = (pointer)&(local_70->label).field_2;
  pcVar2 = (this->label)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar2,pcVar2 + (this->label)._M_string_length);
  pSVar3->colour = this->colour;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&pSVar3->rows,&this->rows);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  ReusableStringStream::~ReusableStringStream(&local_68);
  return pSVar3;
}

Assistant:

SummaryColumn addRow( std::size_t count ) {
        ReusableStringStream rss;
        rss << count;
        std::string row = rss.str();
        for (auto& oldRow : rows) {
            while (oldRow.size() < row.size())
                oldRow = ' ' + oldRow;
            while (oldRow.size() > row.size())
                row = ' ' + row;
        }
        rows.push_back(row);
        return *this;
    }